

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar.c
# Opt level: O0

void ossl_curve448_scalar_add(curve448_scalar_s *out,curve448_scalar_s *a,curve448_scalar_s *b)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  long in_RDX;
  long in_RSI;
  curve448_scalar_s *in_RDI;
  uint i;
  c448_dword_t chain;
  uint local_2c;
  ulong local_28;
  
  local_28 = 0;
  for (local_2c = 0; local_2c < 7; local_2c = local_2c + 1) {
    uVar1 = *(ulong *)(in_RSI + (ulong)local_2c * 8);
    uVar3 = local_28 + uVar1;
    uVar2 = *(ulong *)(in_RDX + (ulong)local_2c * 8);
    local_28 = (ulong)CARRY8(local_28,uVar1) + (ulong)CARRY8(uVar3,uVar2);
    in_RDI->limb[local_2c] = uVar3 + uVar2;
  }
  sc_subx(in_RDI,in_RDI->limb,sc_p,sc_p,local_28);
  return;
}

Assistant:

void
ossl_curve448_scalar_add(curve448_scalar_t out, const curve448_scalar_t a,
                         const curve448_scalar_t b)
{
    c448_dword_t chain = 0;
    unsigned int i;

    for (i = 0; i < C448_SCALAR_LIMBS; i++) {
        chain = (chain + a->limb[i]) + b->limb[i];
        out->limb[i] = (c448_word_t)chain;
        chain >>= WBITS;
    }
    sc_subx(out, out->limb, sc_p, sc_p, (c448_word_t)chain);
}